

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

blow_method * findmeth(char *meth_name)

{
  int iVar1;
  blow_method *local_18;
  blow_method *meth;
  char *meth_name_local;
  
  local_18 = blow_methods + 1;
  while ((local_18 != (blow_method *)0x0 && (iVar1 = strcmp(local_18->name,meth_name), iVar1 != 0)))
  {
    local_18 = local_18->next;
  }
  return local_18;
}

Assistant:

static struct blow_method *findmeth(const char *meth_name) {
	struct blow_method *meth = &blow_methods[1];
	while (meth) {
		if (streq(meth->name, meth_name))
			break;
		meth = meth->next;
	}
	return meth;
}